

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O1

ArgConvertResult<(absl::lts_20240722::FormatConversionCharSet)262144>
absl::lts_20240722::str_format_internal::FormatConvertImpl
          (longdouble v,FormatConversionSpecImpl conv,FormatSinkImpl *sink)

{
  bool bVar1;
  FormatConversionSpecImpl local_10;
  
  local_10.precision_ = conv.precision_;
  local_10._0_8_ = conv._0_8_;
  if (conv.conv_ == 0x12) {
    local_10._1_7_ = conv._1_7_;
    local_10.conv_ = 0xc;
  }
  if ((local_10.conv_ & 0xf8) == 8) {
    bVar1 = ConvertFloatImpl(v,&local_10,sink);
  }
  else {
    bVar1 = false;
  }
  return (ArgConvertResult<(absl::lts_20240722::FormatConversionCharSet)262144>)bVar1;
}

Assistant:

FloatingConvertResult FormatConvertImpl(long double v,
                                        const FormatConversionSpecImpl conv,
                                        FormatSinkImpl *sink) {
  return {ConvertFloatArg(v, conv, sink)};
}